

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O2

void __thiscall
cfdcapi_transaction_CfdAddSignWithPrivkeySimple_Test::TestBody
          (cfdcapi_transaction_CfdAddSignWithPrivkeySimple_Test *this)

{
  char *pcVar1;
  char *in_R9;
  AssertHelper local_70;
  AssertHelper local_68;
  int ret;
  AssertHelper local_58;
  AssertionResult gtest_ar;
  void *handle;
  char *tx_string;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  handle = (void *)0x0;
  ret = CfdCreateHandle(&handle);
  tx_string = (char *)((ulong)tx_string._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&tx_string,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&tx_string);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,700,pcVar1);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&tx_string);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&tx_string);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  tx_string = (char *)CONCAT71(tx_string._1_7_,handle != (void *)0x0);
  if (handle == (void *)0x0) {
    testing::Message::Message((Message *)&local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&tx_string,(AssertionResult *)"(NULL == handle)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2bd,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_20);
  tx_string = (char *)0x0;
  ret = CfdAddSignWithPrivkeySimple
                  (handle,0,
                   "0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000eeffffffef51e1b804cc89d182d279655c3aa89e815b1b309fe287d9b2b55d57b90ec68a0100000000ffffffff02202cb206000000001976a9148280b37df378db99f66f85c95a783a76ac7a6d5988ac9093510d000000001976a9143bde42dbee7e4dbe6a21b2d50ce2f0167faa815988ac11000000"
                   ,"8ac60eb9575db5b2d987e29f301b5b819ea83a5c6579d282d189cc04b8e151ef",1,6,
                   "02715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad",
                   "cRVLMWHogUo51WECRykTbeLNbm5c57iEpSegjdxco3oef6o5dbFi",0x6b22c20,1,false,true,
                   &tx_string);
  local_68.data_ = (AssertHelperData *)((ulong)local_68.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2c6,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  if (ret == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"exp_tx_hex","tx_string",
               "01000000000102fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000eeffffffef51e1b804cc89d182d279655c3aa89e815b1b309fe287d9b2b55d57b90ec68a010000001716001473a4fc7f4c3cd762c86986f61abb7274d3914bf5ffffffff02202cb206000000001976a9148280b37df378db99f66f85c95a783a76ac7a6d5988ac9093510d000000001976a9143bde42dbee7e4dbe6a21b2d50ce2f0167faa815988ac000247304402205c933cb3e81a1cb298e62e237169714bbc3a73c071d5c95d4b8e96b658913d8a022034075443df871165b5c998ead5e728d269182edde68b8b23a9c52a91d69293d0012102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad11000000"
               ,tx_string);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x2c9,pcVar1);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_68);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    CfdFreeStringBuffer(tx_string);
  }
  ret = CfdGetLastErrorCode(handle);
  if (ret != 0) {
    local_68.data_ = (AssertHelperData *)0x0;
    ret = CfdGetLastErrorMessage(handle,(char **)&local_68);
    local_70.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&ret);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x2d1,pcVar1);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pcVar1 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&gtest_ar,"\"\"","str_buffer","",(char *)local_68.data_);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_70);
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x2d2,pcVar1);
      testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_70);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    CfdFreeStringBuffer((char *)local_68.data_);
  }
  ret = CfdFreeHandle(handle);
  local_68.data_ = local_68.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&gtest_ar,"kCfdSuccess","ret",(CfdErrorCode *)&local_68,&ret);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x2d8,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(cfdcapi_transaction, CfdAddSignWithPrivkeySimple) {
  static const char* tx_hex = "0100000002fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000eeffffffef51e1b804cc89d182d279655c3aa89e815b1b309fe287d9b2b55d57b90ec68a0100000000ffffffff02202cb206000000001976a9148280b37df378db99f66f85c95a783a76ac7a6d5988ac9093510d000000001976a9143bde42dbee7e4dbe6a21b2d50ce2f0167faa815988ac11000000";
  static const char* exp_tx_hex = "01000000000102fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000eeffffffef51e1b804cc89d182d279655c3aa89e815b1b309fe287d9b2b55d57b90ec68a010000001716001473a4fc7f4c3cd762c86986f61abb7274d3914bf5ffffffff02202cb206000000001976a9148280b37df378db99f66f85c95a783a76ac7a6d5988ac9093510d000000001976a9143bde42dbee7e4dbe6a21b2d50ce2f0167faa815988ac000247304402205c933cb3e81a1cb298e62e237169714bbc3a73c071d5c95d4b8e96b658913d8a022034075443df871165b5c998ead5e728d269182edde68b8b23a9c52a91d69293d0012102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad11000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;
  ret = CfdAddSignWithPrivkeySimple(
      handle, kCfdNetworkMainnet, tx_hex,
      "8ac60eb9575db5b2d987e29f301b5b819ea83a5c6579d282d189cc04b8e151ef", 1,
      kCfdP2shP2wpkh, "02715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad",
      "cRVLMWHogUo51WECRykTbeLNbm5c57iEpSegjdxco3oef6o5dbFi",
      112340000, kCfdSigHashAll, false, true, &tx_string);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    EXPECT_STREQ(exp_tx_hex, tx_string);
    CfdFreeStringBuffer(tx_string);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}